

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int y;
  int x;
  
  print_foo();
  print(99);
  x = 7;
  y = 9;
  swap_v(9,7);
  swap_r(&x,&y);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1,", y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::operator<<(poVar1,'\n');
  swap_v(9,7);
  swap_v(9,7);
  poVar1 = std::operator<<((ostream *)&std::cout,"cx: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,7);
  poVar1 = std::operator<<(poVar1,", cy: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,9);
  std::operator<<(poVar1,'\n');
  swap_v(9,7);
  swap_v(9,7);
  return 0;
}

Assistant:

int main()
{
	print_foo();
	print(99);

	int x = 7;
	int y = 9;
	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(x, y);
	swap_r(x, y);
	std::cout << "x: " << x << ", y: " << y << '\n';

	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(7, 9);
	// won't compile, because 7 and 9 are rvalues
	//swap_r(7, 9);

	const int cx = 7;
	const int cy = 9;
	swap_v(cx, cy);
	std::cout << "cx: " << cx << ", cy: " << cy << '\n';
	// won't compile, because cx and cy are constant lvalues
	//swap_r(cx, cy);

	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(7.7, 9.9);
	// won't compile, because 7.7 and 9.9 are rvalues
	//swap_r(7.7, 9.9);

	double dx = 7.7;
	double dy = 9.9;
	// arguments passed by value, there is no need to check with cout
	// because we won't see the changes
	swap_v(dx, dy);
	// won't compile because swap_r expects int&
	//swap_r(dx, dy);
	
	return 0;
}